

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseCFG.h
# Opt level: O0

void covenant::parse_rules<covenant::StrParse>(StrParse *input,CFG *g,NonTerminalMap *mapping)

{
  char cVar1;
  bool bVar2;
  CFG *in_RDX;
  StrParse *in_RSI;
  char c;
  NonTerminalMap *in_stack_00000070;
  CFG *in_stack_00000078;
  StrParse *in_stack_00000080;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  cVar1 = StrParse::peek((StrParse *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  parse_rule<covenant::StrParse>(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  bVar2 = StrParse::empty((StrParse *)CONCAT17(cVar1,in_stack_ffffffffffffffe0));
  if ((!bVar2) &&
     (cVar1 = StrParse::peek((StrParse *)CONCAT17(cVar1,in_stack_ffffffffffffffe0)), cVar1 == ';'))
  {
    StrParse::chomp(input);
    consume_blanks<covenant::StrParse>((StrParse *)CONCAT17(cVar1,in_stack_ffffffffffffffe0));
    parse_rules<covenant::StrParse>
              (in_RSI,in_RDX,(NonTerminalMap *)CONCAT17(cVar1,in_stack_ffffffffffffffe0));
  }
  return;
}

Assistant:

void parse_rules(In& input, CFG &g, NonTerminalMap &mapping)
{

  char c = input.peek();
  parse_rule(input, g, mapping);
  
  if(input.empty())
    return;
  
  // Check if we continue parsing
  c = input.peek();
  switch(c)
  {
    case ';':
      // Another rule
      input.chomp();
      consume_blanks(input);
      parse_rules(input, g, mapping);
    default:
      break;
  }
  return;
}